

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::bson::
basic_bson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::read_string(basic_bson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
              *this,string_type *buffer,error_code *ec)

{
  binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *source;
  size_t *psVar1;
  uchar *puVar2;
  uchar *puVar3;
  pointer ppVar4;
  uchar *puVar5;
  undefined8 in_RAX;
  type_conflict2 tVar6;
  ulong uVar7;
  size_t sVar8;
  bson_errc __e;
  ulong uVar9;
  long lVar10;
  size_t length;
  bool bVar11;
  uint8_t c;
  uint8_t buf [4];
  uchar auStack_25 [5];
  
  source = &this->source_;
  puVar2 = (this->source_).current_._M_current;
  puVar3 = (this->source_).end_._M_current;
  uVar7 = 4;
  if ((ulong)((long)puVar3 - (long)puVar2) < 4) {
    uVar7 = (long)puVar3 - (long)puVar2;
  }
  if (puVar3 != puVar2) {
    uVar9 = 0;
    puVar5 = puVar2;
    do {
      (source->current_)._M_current = puVar5 + 1;
      auStack_25[uVar9 + 1] = *puVar5;
      uVar9 = uVar9 + 1;
      puVar5 = puVar5 + 1;
    } while (uVar7 != uVar9);
  }
  psVar1 = &(this->source_).position_;
  *psVar1 = *psVar1 + uVar7;
  psVar1 = &(this->state_stack_).
            super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
  *psVar1 = *psVar1 + uVar7;
  if (3 < (ulong)((long)puVar3 - (long)puVar2)) {
    lVar10 = (long)(int)((ulong)in_RAX >> 0x20);
    if (lVar10 < 1) {
      __e = string_length_is_non_positive;
      goto LAB_002385e7;
    }
    length = lVar10 - 1;
    tVar6 = source_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::read<std::__cxx11::string>(source,buffer,length);
    ppVar4 = (this->state_stack_).
             super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sVar8 = ppVar4[-1].pos + tVar6;
    ppVar4[-1].pos = sVar8;
    if (tVar6 == length) {
      puVar2 = (this->source_).current_._M_current;
      bVar11 = (this->source_).end_._M_current != puVar2;
      uVar7 = (ulong)bVar11;
      if (bVar11) {
        uVar9 = 0;
        do {
          (source->current_)._M_current = puVar2 + 1;
          auStack_25[uVar9] = *puVar2;
          uVar9 = uVar9 + 1;
          puVar2 = puVar2 + 1;
        } while (uVar7 != uVar9);
        psVar1 = &(this->source_).position_;
        *psVar1 = *psVar1 + uVar7;
        ppVar4[-1].pos = sVar8 + uVar7;
        return;
      }
      psVar1 = &(this->source_).position_;
      *psVar1 = *psVar1 + uVar7;
      ppVar4[-1].pos = sVar8 + uVar7;
    }
  }
  __e = unexpected_eof;
LAB_002385e7:
  std::error_code::operator=(ec,__e);
  this->more_ = false;
  return;
}

Assistant:

void read_string(string_type& buffer, std::error_code& ec)
    {
        uint8_t buf[sizeof(int32_t)]; 
        std::size_t n = source_.read(buf, sizeof(int32_t));
        state_stack_.back().pos += n;
        if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        auto len = binary::little_to_native<int32_t>(buf, sizeof(buf));
        if (JSONCONS_UNLIKELY(len < 1))
        {
            ec = bson_errc::string_length_is_non_positive;
            more_ = false;
            return;
        }

        std::size_t size = static_cast<std::size_t>(len) - static_cast<std::size_t>(1);
        n = source_reader<Source>::read(source_, buffer, size);
        state_stack_.back().pos += n;

        if (JSONCONS_UNLIKELY(n != size))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        uint8_t c;
        n = source_.read(&c, 1);
        state_stack_.back().pos += n;
        if (JSONCONS_UNLIKELY(n != 1))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }
    }